

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

bool google::protobuf::internal::anon_unknown_36::GetEnumValidationRange
               (EnumDescriptor *enum_type,int32_t *first,int32_t *last)

{
  bool bVar1;
  int iVar2;
  EnumValueDescriptor *pEVar3;
  int32_t *last_local;
  int32_t *first_local;
  EnumDescriptor *enum_type_local;
  
  bVar1 = IsEnumFullySequential(enum_type);
  if (bVar1) {
    pEVar3 = EnumDescriptor::value(enum_type,0);
    iVar2 = EnumValueDescriptor::number(pEVar3);
    *first = iVar2;
    iVar2 = EnumDescriptor::value_count(enum_type);
    pEVar3 = EnumDescriptor::value(enum_type,iVar2 + -1);
    iVar2 = EnumValueDescriptor::number(pEVar3);
    *last = iVar2;
    enum_type_local._7_1_ = true;
  }
  else {
    enum_type_local._7_1_ = GetEnumValidationRangeSlow(enum_type,first,last);
  }
  return enum_type_local._7_1_;
}

Assistant:

bool GetEnumValidationRange(const EnumDescriptor* enum_type, int32_t& first,
                            int32_t& last) {
  if (!IsEnumFullySequential(enum_type)) {
    // Maybe the labels are not sequential in declaration order, but the values
    // could still be a dense range. Try the slower approach.
    return GetEnumValidationRangeSlow(enum_type, first, last);
  }

  first = enum_type->value(0)->number();
  last = enum_type->value(enum_type->value_count() - 1)->number();
  return true;
}